

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxshift.hpp
# Opt level: O1

void __thiscall soplex::SPxSolverBase<double>::unShift(SPxSolverBase<double> *this)

{
  double *pdVar1;
  double dVar2;
  Representation RVar3;
  uint uVar4;
  Status SVar5;
  SPxOut *pSVar6;
  pointer pdVar7;
  pointer pdVar8;
  Status *pSVar9;
  UpdateVector<double> *pUVar10;
  pointer pdVar11;
  pointer pdVar12;
  pointer pdVar13;
  char cVar14;
  DataArray<soplex::SPxBasisBase<double>::Desc::Status> *pDVar15;
  int iVar16;
  long lVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  Verbosity old_verbosity;
  SPxId l_id;
  double local_50;
  double local_48;
  double local_40;
  DataKey local_38;
  
  pSVar6 = this->spxout;
  if ((pSVar6 != (SPxOut *)0x0) && (4 < (int)pSVar6->m_verbosity)) {
    local_48 = (double)CONCAT44(local_48._4_4_,pSVar6->m_verbosity);
    local_50 = (double)CONCAT44(local_50._4_4_,5);
    (*pSVar6->_vptr_SPxOut[2])();
    pSVar6 = this->spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar6->m_streams[pSVar6->m_verbosity],"DSHIFT07 = ",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar6->m_streams[pSVar6->m_verbosity],"unshifting ...",0xe);
    cVar14 = (char)pSVar6->m_streams[pSVar6->m_verbosity];
    std::ios::widen((char)*(undefined8 *)(*(long *)pSVar6->m_streams[pSVar6->m_verbosity] + -0x18) +
                    cVar14);
    std::ostream::put(cVar14);
    std::ostream::flush();
    (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_48);
  }
  if (this->initialized == true) {
    this->theShift = 0.0;
    if (this->theType == ENTER) {
      local_40 = entertol(this);
      uVar4 = (this->thecovectors->set).thenum;
      if (this->theRep == COLUMN) {
        if (0 < (int)uVar4) {
          lVar17 = (ulong)uVar4 + 1;
          do {
            local_38 = (this->super_SPxBasisBase<double>).theBaseId.data[lVar17 + -2].super_DataKey;
            iVar16 = SPxLPBase<double>::number(&this->super_SPxLPBase<double>,(SPxId *)&local_38);
            if (local_38.info < 0) {
              local_48 = -(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[iVar16];
              local_50 = -(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[iVar16];
            }
            else {
              local_48 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar16];
              local_50 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar16];
            }
            if ((local_48 != local_50) || (NAN(local_48) || NAN(local_50))) {
              pdVar7 = (this->theFvec->super_VectorBase<double>).val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              dVar18 = pdVar7[lVar17 + 0xfffffffffffffffe];
              if (local_40 + local_48 <= dVar18) {
                if (local_48 < dVar18) {
                  this->theShift =
                       ((this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar17 + -2] - local_48) +
                       this->theShift;
                }
              }
              else {
                (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar17 + -2] = local_48;
              }
              dVar18 = pdVar7[lVar17 + 0xfffffffffffffffe];
              if (dVar18 <= local_50 - local_40) {
                if (dVar18 < local_50) {
                  dVar18 = this->theShift -
                           ((this->theLBbound).val.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar17 + -2] - local_50);
                  goto LAB_001be427;
                }
              }
              else {
                (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar17 + -2] = local_50;
              }
            }
            else {
              dVar18 = (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar17 + -2];
              if (dVar18 <= local_48) {
                dVar18 = (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start[lVar17 + -2];
                if (dVar18 < local_50) {
                  dVar18 = (local_50 - dVar18) + this->theShift;
LAB_001be427:
                  this->theShift = dVar18;
                }
              }
              else {
                this->theShift = (dVar18 - local_48) + this->theShift;
              }
            }
            lVar17 = lVar17 + -1;
          } while (1 < lVar17);
        }
        lVar17 = (long)(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                       super_SVSetBase<double>.set.thenum;
        if (0 < lVar17) {
          dVar18 = this->theShift;
          pSVar9 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data;
          pdVar7 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar8 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar11 = (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pdVar12 = (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          lVar17 = lVar17 + 1;
          do {
            if (pSVar9[lVar17 + -2] * this->theRep < 1) {
              dVar2 = pdVar7[lVar17 + -2];
              dVar19 = -pdVar8[lVar17 + -2];
              dVar20 = pdVar11[lVar17 + -2];
              if (-dVar2 < dVar20) {
                dVar18 = dVar18 + dVar2 + dVar20;
                this->theShift = dVar18;
              }
              dVar2 = pdVar12[lVar17 + -2];
              if (dVar2 < dVar19) {
                dVar18 = dVar18 + (dVar19 - dVar2);
                this->theShift = dVar18;
              }
            }
            lVar17 = lVar17 + -1;
          } while (1 < lVar17);
        }
        lVar17 = (long)(this->super_SPxLPBase<double>).super_LPColSetBase<double>.
                       super_SVSetBase<double>.set.thenum;
        if (0 < lVar17) {
          dVar18 = this->theShift;
          pSVar9 = (this->super_SPxBasisBase<double>).thedesc.colstat.data;
          pdVar7 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar8 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar11 = (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pdVar12 = (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          lVar17 = lVar17 + 1;
          do {
            if (pSVar9[lVar17 + -2] * this->theRep < 1) {
              dVar2 = pdVar8[lVar17 + -2];
              dVar20 = pdVar7[lVar17 + -2];
              dVar19 = pdVar11[lVar17 + -2];
              if (dVar2 < dVar19) {
                dVar18 = dVar18 + (dVar19 - dVar2);
                this->theShift = dVar18;
              }
              dVar2 = pdVar12[lVar17 + -2];
              if (dVar2 < dVar20) {
                dVar18 = dVar18 + (dVar20 - dVar2);
                this->theShift = dVar18;
              }
            }
            lVar17 = lVar17 + -1;
          } while (1 < lVar17);
        }
      }
      else {
        if (0 < (int)uVar4) {
          lVar17 = (ulong)uVar4 + 1;
          do {
            local_38 = (this->super_SPxBasisBase<double>).theBaseId.data[lVar17 + -2].super_DataKey;
            iVar16 = SPxLPBase<double>::number(&this->super_SPxLPBase<double>,(SPxId *)&local_38);
            local_50 = 0.0;
            local_48 = 0.0;
            pDVar15 = &(this->super_SPxBasisBase<double>).thedesc.colstat;
            if (local_38.info < 0) {
              pDVar15 = &(this->super_SPxBasisBase<double>).thedesc.rowstat;
            }
            clearDualBounds(this,pDVar15->data[iVar16],&local_48,&local_50);
            pdVar7 = (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            pdVar8 = (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            dVar18 = pdVar7[lVar17 + -2];
            if ((dVar18 != pdVar8[lVar17 + -2]) || (NAN(dVar18) || NAN(pdVar8[lVar17 + -2]))) {
              if (dVar18 <= local_48) {
                this->theShift = this->theShift - (dVar18 - local_48);
              }
              else {
                dVar18 = (dVar18 - local_48) + this->theShift;
LAB_001be994:
                this->theShift = dVar18;
              }
            }
            else {
              pdVar11 = (this->theFvec->super_VectorBase<double>).val.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
              dVar2 = pdVar11[lVar17 + 0xfffffffffffffffe];
              if (local_48 - local_40 <= dVar2) {
                if (local_48 < dVar2) {
                  this->theShift = (dVar18 - local_48) + this->theShift;
                }
              }
              else {
                pdVar7[lVar17 + -2] = local_48;
              }
              dVar18 = pdVar11[lVar17 + 0xfffffffffffffffe];
              if (dVar18 <= local_40 + local_50) {
                if (dVar18 < local_50) {
                  dVar18 = this->theShift - (pdVar8[lVar17 + -2] - local_50);
                  goto LAB_001be994;
                }
              }
              else {
                pdVar8[lVar17 + -2] = local_50;
              }
            }
            lVar17 = lVar17 + -1;
          } while (1 < lVar17);
        }
        lVar17 = (long)(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                       super_SVSetBase<double>.set.thenum;
        if (0 < lVar17) {
          lVar17 = lVar17 + 1;
          do {
            SVar5 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data[lVar17 + -2];
            if (this->theRep * SVar5 < 1) {
              local_50 = 0.0;
              local_48 = 0.0;
              clearDualBounds(this,SVar5,&local_48,&local_50);
              dVar18 = (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar17 + -2];
              if (local_48 < dVar18) {
                this->theShift = (dVar18 - local_48) + this->theShift;
              }
              dVar18 = (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar17 + -2];
              if (dVar18 < local_50) {
                this->theShift = (local_50 - dVar18) + this->theShift;
              }
            }
            lVar17 = lVar17 + -1;
          } while (1 < lVar17);
        }
        lVar17 = (long)(this->super_SPxLPBase<double>).super_LPColSetBase<double>.
                       super_SVSetBase<double>.set.thenum;
        if (0 < lVar17) {
          lVar17 = lVar17 + 1;
          do {
            SVar5 = (this->super_SPxBasisBase<double>).thedesc.colstat.data[lVar17 + -2];
            if (this->theRep * SVar5 < 1) {
              local_50 = 0.0;
              local_48 = 0.0;
              clearDualBounds(this,SVar5,&local_48,&local_50);
              dVar18 = (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar17 + -2];
              if (local_48 < dVar18) {
                this->theShift = (dVar18 - local_48) + this->theShift;
              }
              dVar18 = (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar17 + -2];
              if (dVar18 < local_50) {
                this->theShift = (local_50 - dVar18) + this->theShift;
              }
            }
            lVar17 = lVar17 + -1;
          } while (1 < lVar17);
        }
      }
    }
    else {
      local_40 = leavetol(this);
      RVar3 = this->theRep;
      uVar4 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set
              .thenum;
      if (RVar3 == COLUMN) {
        if (0 < (int)uVar4) {
          lVar17 = (ulong)uVar4 + 1;
          do {
            local_50 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.object.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar17 + -2];
            local_48 = local_50;
            clearDualBounds(this,(this->super_SPxBasisBase<double>).thedesc.rowstat.data
                                 [lVar17 + -2],&local_48,&local_50);
            if (this->theRep * (this->super_SPxBasisBase<double>).thedesc.rowstat.data[lVar17 + -2]
                < 1) {
              pdVar7 = (this->theCoPvec->super_VectorBase<double>).val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              pdVar1 = pdVar7 + lVar17 + 0xfffffffffffffffe;
              if (local_40 + local_48 < *pdVar1 || local_40 + local_48 == *pdVar1) {
                this->theShift =
                     ((this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start[lVar17 + -2] - local_48) +
                     this->theShift;
              }
              else {
                (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar17 + -2] = local_48;
                if ((local_48 == local_50) && (!NAN(local_48) && !NAN(local_50))) {
                  (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl
                  .super__Vector_impl_data._M_start[lVar17 + -2] = local_50;
                }
              }
              if (pdVar7[lVar17 + 0xfffffffffffffffe] <= local_50 - local_40) {
                dVar18 = local_50 -
                         (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start[lVar17 + -2];
                goto LAB_001be07a;
              }
              (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar17 + -2] = local_50;
              if ((local_48 == local_50) && (!NAN(local_48) && !NAN(local_50))) {
                (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar17 + -2] = local_48;
              }
            }
            else {
              dVar18 = (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar17 + -2];
              if ((local_48 < dVar18) ||
                 (local_48 = (this->theLRbound).val.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar17 + -2], dVar18 = local_50,
                 local_48 < local_50)) {
                dVar18 = dVar18 - local_48;
LAB_001be07a:
                this->theShift = dVar18 + this->theShift;
              }
            }
            lVar17 = lVar17 + -1;
          } while (1 < lVar17);
        }
        lVar17 = (long)(this->super_SPxLPBase<double>).super_LPColSetBase<double>.
                       super_SVSetBase<double>.set.thenum;
        if (0 < lVar17) {
          lVar17 = lVar17 + 1;
          do {
            local_50 = -(this->super_SPxLPBase<double>).super_LPColSetBase<double>.object.val.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar17 + -2];
            local_48 = local_50;
            clearDualBounds(this,(this->super_SPxBasisBase<double>).thedesc.colstat.data
                                 [lVar17 + -2],&local_50,&local_48);
            if (this->theRep * (this->super_SPxBasisBase<double>).thedesc.colstat.data[lVar17 + -2]
                < 1) {
              pdVar7 = (this->thePvec->super_VectorBase<double>).val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              pdVar1 = pdVar7 + lVar17 + 0xfffffffffffffffe;
              if (local_40 - local_48 < *pdVar1 || local_40 - local_48 == *pdVar1) {
                this->theShift =
                     local_48 +
                     (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar17 + -2] + this->theShift;
              }
              else {
                (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar17 + -2] = -local_48;
                if ((local_48 == local_50) && (!NAN(local_48) && !NAN(local_50))) {
                  (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl
                  .super__Vector_impl_data._M_start[lVar17 + -2] = -local_50;
                }
              }
              if (pdVar7[lVar17 + 0xfffffffffffffffe] <= -local_50 - local_40) {
                dVar18 = (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start[lVar17 + -2];
LAB_001be249:
                dVar18 = -local_50 - dVar18;
                goto LAB_001be24d;
              }
              (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar17 + -2] = -local_50;
              if ((local_48 == local_50) && (!NAN(local_48) && !NAN(local_50))) {
                (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar17 + -2] = -local_48;
              }
            }
            else {
              dVar18 = (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar17 + -2];
              if (dVar18 <= -local_48) {
                dVar18 = (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start[lVar17 + -2];
                if (dVar18 < -local_50) goto LAB_001be249;
              }
              else {
                dVar18 = dVar18 + local_48;
LAB_001be24d:
                this->theShift = dVar18 + this->theShift;
              }
            }
            lVar17 = lVar17 + -1;
          } while (1 < lVar17);
        }
      }
      else {
        if (0 < (int)uVar4) {
          pdVar7 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar8 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pSVar9 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data;
          pUVar10 = this->thePvec;
          pdVar11 = (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pdVar12 = (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          lVar17 = (ulong)uVar4 + 1;
          do {
            dVar18 = pdVar8[lVar17 + -2];
            dVar2 = pdVar7[lVar17 + -2];
            if ((dVar18 != dVar2) || (NAN(dVar18) || NAN(dVar2))) {
              if (pSVar9[lVar17 + -2] * RVar3 < 1) {
                pdVar13 = (pUVar10->super_VectorBase<double>).val.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
                pdVar1 = pdVar13 + lVar17 + 0xfffffffffffffffe;
                if (local_40 + dVar18 < *pdVar1 || local_40 + dVar18 == *pdVar1) {
                  this->theShift = (pdVar11[lVar17 + -2] - dVar18) + this->theShift;
                }
                else {
                  pdVar11[lVar17 + -2] = dVar18;
                }
                if (pdVar13[lVar17 + 0xfffffffffffffffe] <= dVar2 - local_40) {
                  this->theShift = (dVar2 - pdVar12[lVar17 + -2]) + this->theShift;
                }
                else {
                  pdVar12[lVar17 + -2] = dVar2;
                }
              }
              else {
                dVar20 = pdVar11[lVar17 + -2];
                if (dVar18 < dVar20) goto LAB_001be63f;
                dVar18 = pdVar12[lVar17 + -2];
                if (dVar18 < dVar2) goto LAB_001be612;
              }
            }
            else {
              dVar20 = pdVar11[lVar17 + -2];
              if (dVar18 < dVar20) {
LAB_001be63f:
                this->theShift = (dVar20 - dVar18) + this->theShift;
              }
              else {
                dVar18 = pdVar12[lVar17 + -2];
LAB_001be612:
                this->theShift = (dVar2 - dVar18) + this->theShift;
              }
            }
            lVar17 = lVar17 + -1;
          } while (1 < lVar17);
        }
        lVar17 = (long)(this->super_SPxLPBase<double>).super_LPColSetBase<double>.
                       super_SVSetBase<double>.set.thenum;
        if (0 < lVar17) {
          pdVar7 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar8 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pSVar9 = (this->super_SPxBasisBase<double>).thedesc.colstat.data;
          pUVar10 = this->theCoPvec;
          pdVar11 = (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pdVar12 = (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          lVar17 = lVar17 + 1;
          do {
            dVar18 = pdVar8[lVar17 + -2];
            dVar2 = pdVar7[lVar17 + -2];
            if ((dVar18 != dVar2) || (NAN(dVar18) || NAN(dVar2))) {
              if (pSVar9[lVar17 + -2] * RVar3 < 1) {
                pdVar13 = (pUVar10->super_VectorBase<double>).val.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
                pdVar1 = pdVar13 + lVar17 + 0xfffffffffffffffe;
                if (local_40 + dVar18 < *pdVar1 || local_40 + dVar18 == *pdVar1) {
                  this->theShift = (pdVar11[lVar17 + -2] - dVar18) + this->theShift;
                }
                else {
                  pdVar11[lVar17 + -2] = dVar18;
                }
                if (pdVar13[lVar17 + 0xfffffffffffffffe] <= dVar2 - local_40) {
                  this->theShift = (dVar2 - pdVar12[lVar17 + -2]) + this->theShift;
                }
                else {
                  pdVar12[lVar17 + -2] = dVar2;
                }
              }
              else {
                dVar20 = pdVar11[lVar17 + -2];
                if (dVar18 < dVar20) goto LAB_001be794;
                dVar18 = pdVar12[lVar17 + -2];
                if (dVar18 < dVar2) goto LAB_001be767;
              }
            }
            else {
              dVar20 = pdVar11[lVar17 + -2];
              if (dVar18 < dVar20) {
LAB_001be794:
                this->theShift = (dVar20 - dVar18) + this->theShift;
              }
              else {
                dVar18 = pdVar12[lVar17 + -2];
LAB_001be767:
                this->theShift = (dVar2 - dVar18) + this->theShift;
              }
            }
            lVar17 = lVar17 + -1;
          } while (1 < lVar17);
        }
      }
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::unShift(void)
{
   SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "DSHIFT07 = " << "unshifting ..." << std::endl;);

   if(isInitialized())
   {
      int i;
      R t_up, t_low;
      const typename SPxBasisBase<R>::Desc& ds = this->desc();

      theShift = 0;

      if(type() == ENTER)
      {
         R eps = entertol();

         if(rep() == COLUMN)
         {
            for(i = dim(); i-- > 0;)
            {
               SPxId l_id = this->baseId(i);
               int l_num = this->number(l_id);

               if(l_id.type() == SPxId::ROW_ID)
               {
                  t_up = -this->lhs(l_num);
                  t_low = -this->rhs(l_num);
               }
               else
               {
                  assert(l_id.type() == SPxId::COL_ID);
                  t_up = this->upper(l_num);
                  t_low = this->lower(l_num);
               }

               if(t_up != t_low)
               {
                  if((*theFvec)[i] < t_up + eps)  // check allowed violation
                     theUBbound[i] = t_up; // reset shifted bound to original
                  else if((*theFvec)[i] > t_up)  // shifted bound is required for feasibility
                     theShift += theUBbound[i] - t_up;

                  if((*theFvec)[i] > t_low - eps)  // check allowed violation
                     theLBbound[i] = t_low; // reset shifted bound to original
                  else if((*theFvec)[i] < t_low)  // shifted bound is required for feasibility
                     theShift -= theLBbound[i] - t_low;
               }
               else
               {
                  if(theUBbound[i] > t_up)
                     theShift += theUBbound[i] - t_up;
                  else if(theLBbound[i] < t_low)
                     theShift += t_low - theLBbound[i];
               }
            }

            for(i = this->nRows(); i-- > 0;)
            {
               if(!isBasic(ds.rowStatus(i)))
               {
                  t_up = -this->lhs(i);
                  t_low = -this->rhs(i);

                  if(theURbound[i] > t_up)  // what about t_up == t_low ?
                     theShift += theURbound[i] - t_up;

                  if(t_low > theLRbound[i])  // what about t_up == t_low ?
                     theShift += t_low - theLRbound[i];
               }
            }

            for(i = this->nCols(); i-- > 0;)
            {
               if(!isBasic(ds.colStatus(i)))
               {
                  t_up = this->upper(i);
                  t_low = this->lower(i);

                  if(theUCbound[i] > t_up)  // what about t_up == t_low ?
                     theShift += theUCbound[i] - t_up;

                  if(t_low > theLCbound[i])  // what about t_up == t_low ?
                     theShift += t_low - theLCbound[i];
               }
            }
         }
         else
         {
            assert(rep() == ROW);

            for(i = dim(); i-- > 0;)
            {
               SPxId l_id = this->baseId(i);
               int l_num = this->number(l_id);
               t_up = t_low = 0;

               if(l_id.type() == SPxId::ROW_ID)
                  clearDualBounds(ds.rowStatus(l_num), t_up, t_low);
               else
                  clearDualBounds(ds.colStatus(l_num), t_up, t_low);

               if(theUBbound[i] != theLBbound[i])
               {
                  if(theUBbound[i] > t_up)
                     theShift += theUBbound[i] - t_up;
                  else
                     theShift -= theUBbound[i] - t_up;
               }
               else
               {
                  /* if the basic (primal or dual) variable is fixed (e.g., basis status P_FREE in row representation)
                   * then shiftFvec() and shiftPvec() do not relax the bounds, but shift both, hence they may be outside
                   * of [t_low,t_up] */
                  assert(theLBbound[i] == theUBbound[i] || theUBbound[i] >= t_up);
                  assert(theLBbound[i] == theUBbound[i] || theLBbound[i] <= t_low);

                  if((*theFvec)[i] < t_up - eps)
                     theUBbound[i] = t_up;
                  else if((*theFvec)[i] > t_up)
                     theShift += theUBbound[i] - t_up;

                  if((*theFvec)[i] > t_low + eps)
                     theLBbound[i] = t_low;
                  else if((*theFvec)[i] < t_low)
                     theShift -= theLBbound[i] - t_low;
               }
            }

            for(i = this->nRows(); i-- > 0;)
            {
               if(!isBasic(ds.rowStatus(i)))
               {
                  t_up = t_low = 0;
                  clearDualBounds(ds.rowStatus(i), t_up, t_low);

                  if(theURbound[i] > t_up)  // what about t_up == t_low ?
                     theShift += theURbound[i] - t_up;

                  if(t_low > theLRbound[i])  // what about t_up == t_low ?
                     theShift += t_low - theLRbound[i];
               }
            }

            for(i = this->nCols(); i-- > 0;)
            {
               if(!isBasic(ds.colStatus(i)))
               {
                  t_up = t_low = 0;
                  clearDualBounds(ds.colStatus(i), t_up, t_low);

                  if(theUCbound[i] > t_up)  // what about t_up == t_low ?
                     theShift += theUCbound[i] - t_up;

                  if(t_low > theLCbound[i])  // what about t_up == t_low ?
                     theShift += t_low - theLCbound[i];
               }
            }
         }
      }
      else
      {
         assert(type() == LEAVE);

         R eps = leavetol();

         if(rep() == COLUMN)
         {
            for(i = this->nRows(); i-- > 0;)
            {
               t_up = t_low = this->maxRowObj(i);
               clearDualBounds(ds.rowStatus(i), t_up, t_low);

               if(!isBasic(ds.rowStatus(i)))
               {
                  if((*theCoPvec)[i] < t_up + eps)
                  {
                     theURbound[i] = t_up; // reset bound to original value

                     if(t_up == t_low)
                        theLRbound[i] = t_low; // for fixed rows we change both bounds
                  }
                  else
                     theShift += theURbound[i] - t_up;

                  if((*theCoPvec)[i] > t_low - eps)
                  {
                     theLRbound[i] = t_low; // reset bound to original value

                     if(t_up == t_low)
                        theURbound[i] = t_up; // for fixed rows we change both bounds
                  }
                  else
                     theShift += t_low - theLRbound[i];
               }
               else if(theURbound[i] > t_up)
                  theShift += theURbound[i] - t_up;
               else if(theLRbound[i] < t_low)
                  theShift += t_low - theLRbound[i];
            }

            for(i = this->nCols(); i-- > 0;)
            {
               t_up = t_low = -this->maxObj(i);
               clearDualBounds(ds.colStatus(i), t_low, t_up);

               if(!isBasic(ds.colStatus(i)))
               {
                  if((*thePvec)[i] < -t_up + eps)
                  {
                     theUCbound[i] = -t_up; // reset bound to original value

                     if(t_up == t_low)
                        theLCbound[i] = -t_low; // for fixed variables we change both bounds
                  }
                  else
                     theShift += theUCbound[i] - (-t_up);

                  if((*thePvec)[i] > -t_low - eps)
                  {
                     theLCbound[i] = -t_low; // reset bound to original value

                     if(t_up == t_low)
                        theUCbound[i] = -t_up; // for fixed variables we change both bounds
                  }
                  else
                     theShift += (-t_low) - theLCbound[i];
               }
               else if(theUCbound[i] > -t_up)
                  theShift += theUCbound[i] - (-t_up);
               else if(theLCbound[i] < -t_low)
                  theShift += (-t_low) - theLCbound[i];
            }
         }
         else
         {
            assert(rep() == ROW);

            for(i = this->nRows(); i-- > 0;)
            {
               t_up = this->rhs(i);
               t_low = this->lhs(i);

               if(t_up == t_low)
               {
                  if(theURbound[i] > t_up)
                     theShift += theURbound[i] - t_up;
                  else
                     theShift += t_low - theLRbound[i];
               }
               else if(!isBasic(ds.rowStatus(i)))
               {
                  if((*thePvec)[i] < t_up + eps)
                     theURbound[i] = t_up; // reset bound to original value
                  else
                     theShift += theURbound[i] - t_up;

                  if((*thePvec)[i] > t_low - eps)
                     theLRbound[i] = t_low; // reset bound to original value
                  else
                     theShift += t_low - theLRbound[i];
               }
               else if(theURbound[i] > t_up)
                  theShift += theURbound[i] - t_up;
               else if(theLRbound[i] < t_low)
                  theShift += t_low - theLRbound[i];
            }

            for(i = this->nCols(); i-- > 0;)
            {
               t_up = this->upper(i);
               t_low = this->lower(i);

               if(t_up == t_low)
               {
                  if(theUCbound[i] > t_up)
                     theShift += theUCbound[i] - t_up;
                  else
                     theShift += t_low - theLCbound[i];
               }
               else if(!isBasic(ds.colStatus(i)))
               {
                  if((*theCoPvec)[i] < t_up + eps)
                     theUCbound[i] = t_up; // reset bound to original value
                  else
                     theShift += theUCbound[i] - t_up;

                  if((*theCoPvec)[i] > t_low - eps)
                     theLCbound[i] = t_low; // reset bound to original value
                  else
                     theShift += t_low - theLCbound[i];
               }
               else if(theUCbound[i] > t_up)
                  theShift += theUCbound[i] - t_up;
               else if(theLCbound[i] < t_low)
                  theShift += t_low - theLCbound[i];
            }
         }
      }
   }
}